

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astPragmaNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  size_t slotCount;
  sysbvm_tuple_t array;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  _Bool local_e1;
  ulong local_e0;
  size_t i_1;
  size_t i;
  size_t pragmaArgumentCount;
  undefined1 auStack_c0 [7];
  _Bool isLiteral;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_72_9_6444e132 gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar1 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x48);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_COUNT;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar2 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,*psVar1);
  gcFrameRecord.roots[3] = sVar2;
  _auStack_c0 = (sysbvm_stackFrameRecord_s *)0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = gcFrameRecord.roots[2];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)auStack_c0);
  sVar2 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                    (context,gcFrameRecord.roots[5],(context->roots).symbolType,*psVar1);
  pragmaArgumentCount._7_1_ = sysbvm_astNode_isLiteralNode(context,sVar2);
  slotCount = sysbvm_array_getSize(gcFrameRecord.roots[6]);
  array = sysbvm_array_create(context,slotCount);
  for (i_1 = 0; i_1 < slotCount; i_1 = i_1 + 1) {
    sVar3 = sysbvm_array_at(gcFrameRecord.roots[6],i_1);
    sVar3 = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context,sVar3,*psVar1);
    local_e1 = false;
    if (pragmaArgumentCount._7_1_ != false) {
      local_e1 = sysbvm_astNode_isLiteralNode(context,sVar3);
    }
    pragmaArgumentCount._7_1_ = local_e1;
    sysbvm_array_atPut(array,i_1,sVar3);
  }
  if (pragmaArgumentCount._7_1_ == false) {
    gcFrameRecord.roots[6] = array;
    gcFrameRecord.roots[4] = (context->roots).pragmaType;
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_c0);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    context_local = (sysbvm_context_t *)gcFrameRecord.roots;
  }
  else {
    sVar2 = sysbvm_astLiteralNode_getValue(sVar2);
    sVar3 = sysbvm_array_create(context,slotCount);
    for (local_e0 = 0; local_e0 < slotCount; local_e0 = local_e0 + 1) {
      sVar4 = sysbvm_array_at(array,local_e0);
      sVar4 = sysbvm_astLiteralNode_getValue(sVar4);
      sysbvm_array_atPut(sVar3,local_e0,sVar4);
    }
    sVar2 = sysbvm_pragma_create(context,sVar2,sVar3);
    context_local =
         (sysbvm_context_t *)sysbvm_astLiteralNode_create(context,gcFrameRecord.roots[2],sVar2);
    sysbvm_analysisEnvironment_addPragma(context,*psVar1,sVar2);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_c0);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_astPragmaNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astPragmaNode_t *pragmaNode;
        sysbvm_tuple_t analyzedSelector;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;

        sysbvm_tuple_t literalPragmaSelector;
        sysbvm_tuple_t literalPragmaArguments;
        sysbvm_tuple_t literalPragma;
        sysbvm_tuple_t literalPragmaNode;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.pragmaNode = (sysbvm_astPragmaNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.pragmaNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.pragmaNode->super.sourcePosition);

    gcFrame.analyzedSelector = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.pragmaNode->selector, context->roots.symbolType, *environment);
    bool isLiteral = sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedSelector);

    size_t pragmaArgumentCount = sysbvm_array_getSize(gcFrame.pragmaNode->arguments);
    gcFrame.analyzedArguments = sysbvm_array_create(context, pragmaArgumentCount);
    for(size_t i = 0; i < pragmaArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at(gcFrame.pragmaNode->arguments, i);
        gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.argumentNode, *environment);
        isLiteral = isLiteral && sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedArgument);
        sysbvm_array_atPut(gcFrame.analyzedArguments, i, gcFrame.analyzedArgument);
    }

    if(isLiteral)
    {
        gcFrame.literalPragmaSelector = sysbvm_astLiteralNode_getValue(gcFrame.analyzedSelector);
        gcFrame.literalPragmaArguments = sysbvm_array_create(context, pragmaArgumentCount);
        for(size_t i = 0; i < pragmaArgumentCount; ++i)
            sysbvm_array_atPut(gcFrame.literalPragmaArguments, i, sysbvm_astLiteralNode_getValue(sysbvm_array_at(gcFrame.analyzedArguments, i)));
        
        gcFrame.literalPragma = sysbvm_pragma_create(context, gcFrame.literalPragmaSelector, gcFrame.literalPragmaArguments);
        gcFrame.literalPragmaNode = sysbvm_astLiteralNode_create(context, gcFrame.pragmaNode->super.sourcePosition, gcFrame.literalPragma);
        sysbvm_analysisEnvironment_addPragma(context, *environment, gcFrame.literalPragma);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return (sysbvm_tuple_t)gcFrame.literalPragmaNode;
    }

    gcFrame.pragmaNode->arguments = gcFrame.analyzedArguments;
    gcFrame.pragmaNode->super.analyzedType = context->roots.pragmaType;
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.pragmaNode;
}